

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flexbuffers.h
# Opt level: O2

TypedVector * __thiscall flexbuffers::Map::Keys(TypedVector *__return_storage_ptr__,Map *this)

{
  byte bVar1;
  ulong uVar2;
  ulong uVar3;
  ulong *puVar4;
  
  bVar1 = (this->super_Vector).super_Sized.super_Object.byte_width_;
  uVar2 = (ulong)bVar1;
  puVar4 = (ulong *)((this->super_Vector).super_Sized.super_Object.data_ + uVar2 * -3);
  if (uVar2 < 4) {
    if (bVar1 < 2) {
      uVar3 = (ulong)(byte)*puVar4;
      bVar1 = *(byte *)((long)puVar4 + uVar2);
    }
    else {
      uVar3 = (ulong)(ushort)*puVar4;
      bVar1 = (byte)*(undefined2 *)((long)puVar4 + uVar2);
    }
  }
  else if (bVar1 < 8) {
    uVar3 = (ulong)(uint)*puVar4;
    bVar1 = (byte)*(undefined4 *)((long)puVar4 + uVar2);
  }
  else {
    bVar1 = (byte)*(undefined8 *)((long)puVar4 + uVar2);
    uVar3 = *puVar4;
  }
  Sized::Sized(&__return_storage_ptr__->super_Sized,(uint8_t *)((long)puVar4 - uVar3),bVar1);
  __return_storage_ptr__->type_ = FBT_KEY;
  return __return_storage_ptr__;
}

Assistant:

TypedVector Keys() const {
    const size_t num_prefixed_fields = 3;
    auto keys_offset = data_ - byte_width_ * num_prefixed_fields;
    return TypedVector(Indirect(keys_offset, byte_width_),
                       static_cast<uint8_t>(
                           ReadUInt64(keys_offset + byte_width_, byte_width_)),
                       FBT_KEY);
  }